

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::ActiveBuiltinHandler::handle
          (ActiveBuiltinHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  Compiler *pCVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t id;
  SPIRVariable *var_00;
  SPIRConstant *this_00;
  mapped_type *pmVar4;
  size_t sVar5;
  Decoration *pDVar6;
  TypedID *pTVar7;
  SPIRType *type_00;
  Bitset *local_88;
  Decoration *decorations;
  uint local_60;
  uint32_t index;
  uint32_t i_2;
  uint32_t count_2;
  Bitset *flags;
  SPIRType *type;
  SPIRVariable *var;
  uint32_t i_1;
  uint32_t count_1;
  uint32_t i;
  uint32_t count;
  uint32_t length_local;
  uint32_t *args_local;
  Op opcode_local;
  ActiveBuiltinHandler *this_local;
  
  if (opcode == OpFunctionCall) {
    if (2 < length) {
      for (var._4_4_ = 0; var._4_4_ < length - 3; var._4_4_ = var._4_4_ + 1) {
        add_if_builtin(this,args[(ulong)var._4_4_ + 3]);
      }
      return true;
    }
    return false;
  }
  if (opcode != OpLoad) {
    if (opcode == OpStore) {
      if (length != 0) {
        add_if_builtin(this,*args);
        return true;
      }
      return false;
    }
    if (opcode == OpCopyMemory) {
      if (1 < length) {
        add_if_builtin(this,*args);
        add_if_builtin(this,args[1]);
        return true;
      }
      return false;
    }
    if (opcode - OpAccessChain < 3) {
      if (length < 4) {
        return false;
      }
      var_00 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,args[2]);
      if (var_00 == (SPIRVariable *)0x0) {
        return true;
      }
      add_if_builtin(this,args[2]);
      flags = (Bitset *)get_variable_data_type(this->compiler,var_00);
      if (var_00->storage == StorageClassInput) {
        local_88 = &this->compiler->active_input_builtins;
      }
      else {
        local_88 = &this->compiler->active_output_builtins;
      }
      local_60 = 0;
      do {
        if (length - 3 <= local_60) {
          return true;
        }
        if ((opcode == OpPtrAccessChain) && (local_60 == 0)) {
          pCVar1 = this->compiler;
          uVar3 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)((long)&flags[4].higher._M_h._M_bucket_count + 4));
          flags = (Bitset *)get<spirv_cross::SPIRType>(pCVar1,uVar3);
        }
        else {
          bVar2 = VectorView<unsigned_int>::empty
                            ((VectorView<unsigned_int> *)&(flags->higher)._M_h._M_element_count);
          if (bVar2) {
            if (*(int *)((long)&(flags->higher)._M_h._M_buckets + 4) != 0xf) {
              return true;
            }
            this_00 = get<spirv_cross::SPIRConstant>(this->compiler,args[(ulong)local_60 + 3]);
            uVar3 = SPIRConstant::scalar(this_00,0,0);
            pmVar4 = ::std::
                     unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                     ::operator[](&(this->compiler->ir).meta,(key_type *)&flags->higher);
            sVar5 = VectorView<spirv_cross::Meta::Decoration>::size
                              (&(pmVar4->members).super_VectorView<spirv_cross::Meta::Decoration>);
            if (uVar3 < (uint)sVar5) {
              pmVar4 = ::std::
                       unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                       ::operator[](&(this->compiler->ir).meta,(key_type *)&flags->higher);
              pDVar6 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                                 (&(pmVar4->members).super_VectorView<spirv_cross::Meta::Decoration>
                                  ,(ulong)uVar3);
              if ((pDVar6->builtin & 1U) != 0) {
                Bitset::set(local_88,pDVar6->builtin_type);
                pCVar1 = this->compiler;
                pTVar7 = (TypedID *)
                         VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                                   ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                                    &flags[2].higher,(ulong)uVar3);
                id = TypedID::operator_cast_to_unsigned_int(pTVar7);
                type_00 = get<spirv_cross::SPIRType>(pCVar1,id);
                handle_builtin(this,type_00,pDVar6->builtin_type,&pDVar6->decoration_flags);
              }
            }
            pCVar1 = this->compiler;
            pTVar7 = (TypedID *)
                     VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                               ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                                &flags[2].higher,(ulong)uVar3);
            uVar3 = TypedID::operator_cast_to_unsigned_int(pTVar7);
            flags = (Bitset *)get<spirv_cross::SPIRType>(pCVar1,uVar3);
          }
          else {
            pCVar1 = this->compiler;
            uVar3 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)((long)&flags[4].higher._M_h._M_bucket_count + 4));
            flags = (Bitset *)get<spirv_cross::SPIRType>(pCVar1,uVar3);
          }
        }
        local_60 = local_60 + 1;
      } while( true );
    }
    if (opcode != OpCopyObject) {
      if (opcode == OpSelect) {
        if (4 < length) {
          add_if_builtin(this,args[3]);
          add_if_builtin(this,args[4]);
          return true;
        }
        return false;
      }
      if (opcode != OpPhi) {
        return true;
      }
      if (1 < length) {
        for (i_1 = 0; i_1 < length - 2; i_1 = i_1 + 2) {
          add_if_builtin(this,args[(ulong)i_1 + 2]);
        }
        return true;
      }
      return false;
    }
  }
  if (2 < length) {
    add_if_builtin(this,args[2]);
    return true;
  }
  return false;
}

Assistant:

bool Compiler::ActiveBuiltinHandler::handle(spv::Op opcode, const uint32_t *args, uint32_t length)
{
	switch (opcode)
	{
	case OpStore:
		if (length < 1)
			return false;

		add_if_builtin(args[0]);
		break;

	case OpCopyMemory:
		if (length < 2)
			return false;

		add_if_builtin(args[0]);
		add_if_builtin(args[1]);
		break;

	case OpCopyObject:
	case OpLoad:
		if (length < 3)
			return false;

		add_if_builtin(args[2]);
		break;

	case OpSelect:
		if (length < 5)
			return false;

		add_if_builtin(args[3]);
		add_if_builtin(args[4]);
		break;

	case OpPhi:
	{
		if (length < 2)
			return false;

		uint32_t count = length - 2;
		args += 2;
		for (uint32_t i = 0; i < count; i += 2)
			add_if_builtin(args[i]);
		break;
	}

	case OpFunctionCall:
	{
		if (length < 3)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
			add_if_builtin(args[i]);
		break;
	}

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 4)
			return false;

		// Only consider global variables, cannot consider variables in functions yet, or other
		// access chains as they have not been created yet.
		auto *var = compiler.maybe_get<SPIRVariable>(args[2]);
		if (!var)
			break;

		// Required if we access chain into builtins like gl_GlobalInvocationID.
		add_if_builtin(args[2]);

		// Start traversing type hierarchy at the proper non-pointer types.
		auto *type = &compiler.get_variable_data_type(*var);

		auto &flags =
		    var->storage == StorageClassInput ? compiler.active_input_builtins : compiler.active_output_builtins;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			// Pointers
			if (opcode == OpPtrAccessChain && i == 0)
			{
				type = &compiler.get<SPIRType>(type->parent_type);
				continue;
			}

			// Arrays
			if (!type->array.empty())
			{
				type = &compiler.get<SPIRType>(type->parent_type);
			}
			// Structs
			else if (type->basetype == SPIRType::Struct)
			{
				uint32_t index = compiler.get<SPIRConstant>(args[i]).scalar();

				if (index < uint32_t(compiler.ir.meta[type->self].members.size()))
				{
					auto &decorations = compiler.ir.meta[type->self].members[index];
					if (decorations.builtin)
					{
						flags.set(decorations.builtin_type);
						handle_builtin(compiler.get<SPIRType>(type->member_types[index]), decorations.builtin_type,
						               decorations.decoration_flags);
					}
				}

				type = &compiler.get<SPIRType>(type->member_types[index]);
			}
			else
			{
				// No point in traversing further. We won't find any extra builtins.
				break;
			}
		}
		break;
	}

	default:
		break;
	}

	return true;
}